

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O3

void __thiscall QHostAddress::QHostAddress(QHostAddress *this,SpecialAddress address)

{
  QHostAddressPrivate *pQVar1;
  
  pQVar1 = (QHostAddressPrivate *)operator_new(0x38);
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)0x0;
  (pQVar1->scopeId).d.d = (Data *)0x0;
  (pQVar1->scopeId).d.ptr = (char16_t *)0x0;
  (pQVar1->scopeId).d.size = 0;
  pQVar1->a = 0;
  pQVar1->protocol = -1;
  (pQVar1->field_1).a6_64.c[0] = 0;
  (pQVar1->field_1).a6_64.c[1] = 0;
  (this->d).d.ptr = pQVar1;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)((int)(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  setAddress(this,address);
  return;
}

Assistant:

QHostAddress::QHostAddress(SpecialAddress address)
    : d(new QHostAddressPrivate)
{
    setAddress(address);
}